

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_types.c
# Opt level: O0

msgs_t * allocateMsgs(picnic_instance_t *params)

{
  long in_RDI;
  uint32_t j;
  uint32_t i;
  uint8_t *slab;
  msgs_t *msgs;
  uint local_28;
  uint local_24;
  uint8_t *local_20;
  msgs_t *local_8;
  
  local_8 = (msgs_t *)malloc((ulong)*(ushort *)(in_RDI + 4) * 0x90);
  if (local_8 == (msgs_t *)0x0) {
    local_8 = (msgs_t *)0x0;
  }
  else {
    local_20 = (uint8_t *)
               calloc(1,(long)(int)((uint)*(ushort *)(in_RDI + 4) * (uint)*(byte *)(in_RDI + 0xb) *
                                   ((*(byte *)(in_RDI + 9) + 7) / 8) * 8));
    if (local_20 == (uint8_t *)0x0) {
      free(local_8);
      local_8 = (msgs_t *)0x0;
    }
    else {
      for (local_24 = 0; local_24 < *(ushort *)(in_RDI + 4); local_24 = local_24 + 1) {
        local_8[local_24].pos = 0;
        local_8[local_24].unopened = -1;
        for (local_28 = 0; local_28 < *(byte *)(in_RDI + 0xb); local_28 = local_28 + 1) {
          local_8[local_24].msgs[local_28] = local_20;
          local_20 = local_20 + (int)((*(byte *)(in_RDI + 9) + 7) / 8 << 3);
        }
      }
    }
  }
  return local_8;
}

Assistant:

msgs_t* allocateMsgs(const picnic_instance_t* params) {
  msgs_t* msgs = malloc(params->num_rounds * sizeof(msgs_t));
  if (!msgs) {
    return NULL;
  }

  uint8_t* slab =
      calloc(1, params->num_rounds * params->num_MPC_parties * ((params->view_size + 7) / 8 * 8));
  if (!slab) {
    free(msgs);
    return NULL;
  }

  for (uint32_t i = 0; i < params->num_rounds; i++) {
    msgs[i].pos      = 0;
    msgs[i].unopened = -1;

    for (uint32_t j = 0; j < params->num_MPC_parties; j++) {
      msgs[i].msgs[j] = slab;
      slab += (params->view_size + 7) / 8 * 8;
    }
  }

  return msgs;
}